

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-format.cc
# Opt level: O2

string * __thiscall
tinyusdz::crate::GetCrateDataTypeRepr_abi_cxx11_
          (string *__return_storage_ptr__,crate *this,CrateDataType dty)

{
  char *pcVar1;
  value_type *pvVar2;
  ostream *poVar3;
  expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tyRet;
  stringstream ss;
  expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  eStack_1d8;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  GetCrateDataType_abi_cxx11_(&eStack_1d8,(crate *)(ulong)(uint)dty.name,(uint)dty.name);
  if (eStack_1d8.contained.
      super_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value == false) {
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"[Invalid]",(allocator *)local_1b0);
  }
  else {
    pvVar2 = nonstd::expected_lite::
             expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::value(&eStack_1d8);
    pcVar1 = pvVar2->name;
    ::std::__cxx11::stringstream::stringstream(local_1b0);
    poVar3 = ::std::operator<<(local_1a0,"CrateDataType: ");
    poVar3 = ::std::operator<<(poVar3,pcVar1);
    poVar3 = ::std::operator<<(poVar3,"(");
    poVar3 = ::std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = ::std::operator<<(poVar3,"), supports_array = ");
    ::std::ostream::_M_insert<bool>(SUB81(poVar3,0));
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  nonstd::expected_lite::
  expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~expected(&eStack_1d8);
  return __return_storage_ptr__;
}

Assistant:

std::string GetCrateDataTypeRepr(CrateDataType dty) {
  auto tyRet = GetCrateDataType(static_cast<int32_t>(dty.dtype_id));
  if (!tyRet) {
    return "[Invalid]";
  }

  const CrateDataType ty = tyRet.value();

  std::stringstream ss;
  ss << "CrateDataType: " << ty.name << "("
     << static_cast<uint32_t>(ty.dtype_id)
     << "), supports_array = " << ty.supports_array;
  return ss.str();
}